

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

int quasigeometric_cdf_inv(double cdf,double a,double b)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    iVar1 = 0;
    if (a <= cdf) {
      iVar1 = 1;
      if ((b != 0.0) || (NAN(b))) {
        dVar2 = log(1.0 - cdf);
        dVar3 = log(1.0 - a);
        dVar4 = log(b);
        iVar1 = (int)((dVar2 - dVar3) / dVar4) + 1;
      }
    }
    return iVar1;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"QUASIGEOMETRIC_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

int quasigeometric_cdf_inv ( double cdf, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    QUASIGEOMETRIC_CDF_INV inverts the Quasigeometric CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    29 January 2009
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0
//
//    Input, double A, the probability of 0 successes.
//    0.0 <= A <= 1.0.
//
//    Input, double B, the depreciation constant.
//    0.0 <= B < 1.0.
//
//    Output, int QUASIGEOMETRIC_CDF_INV, the corresponding value of X.
//
{
  int x;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << "\n";
    cerr << "QUASIGEOMETRIC_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf < a )
  {
    x = 0;
  }
  else if ( b == 0.0 )
  {
    x = 1;
  }
  else
  {
    x = 1 + static_cast< int >( ( log ( 1.0 - cdf ) - log ( 1.0 - a ) ) / log ( b ) );
  }

  return x;
}